

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_16::NameResolver::ResolveLabelVar(NameResolver *this,Var *var)

{
  long lVar1;
  pointer pbVar2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_type *psVar7;
  long lVar8;
  bool bVar9;
  
  if (var->type_ != Name) {
    return;
  }
  pbVar2 = (this->labels_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)((ulong)((long)(this->labels_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5) - 1;
  if (-1 < (int)uVar5) {
    sVar3 = (var->field_2).name_._M_string_length;
    uVar6 = uVar5 >> 0x1f;
    psVar7 = &pbVar2[uVar5]._M_string_length;
    lVar8 = 0;
    do {
      __n = *psVar7;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar7 + -1))->_M_dataplus)._M_p,(var->field_2).name_._M_dataplus._M_p,__n
                       ), iVar4 == 0)))) {
        Var::set_index(var,-(int)lVar8);
        if (uVar6 == 0) {
          return;
        }
        break;
      }
      lVar1 = lVar8 + (ulong)uVar5 + 1;
      lVar8 = lVar8 + -1;
      psVar7 = psVar7 + -4;
      bVar9 = lVar1 + -1 < 0;
      uVar6 = (uint)(lVar1 == 1 || bVar9);
    } while (lVar1 != 1 && !bVar9);
  }
  if (var->type_ == Name) {
    PrintError(this,&var->loc,"undefined label variable \"%s\"",
               (var->field_2).name_._M_dataplus._M_p);
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3f,"const std::string &wabt::Var::name() const");
}

Assistant:

void NameResolver::ResolveLabelVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        var->set_index(labels_.size() - i - 1);
        return;
      }
    }
    PrintError(&var->loc, "undefined label variable \"%s\"",
               var->name().c_str());
  }
}